

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O3

Preface * __thiscall ASDCP::MXF::Preface::WriteToTLVSet(Preface *this,TLVWriter *TLVSet)

{
  MDDEntry *pMVar1;
  MDDEntry *in_RDX;
  TLVWriter local_80;
  
  InterchangeObject::WriteToTLVSet(&this->super_InterchangeObject,TLVSet);
  if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
    pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                              MDD_Preface_LastModifiedDate);
    TLVWriter::WriteObject(&local_80,in_RDX,(IArchive *)pMVar1);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
    Kumu::Result_t::~Result_t((Result_t *)&local_80);
    if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
      pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,MDD_Preface_Version);
      TLVWriter::WriteUi16(&local_80,in_RDX,(ui16_t *)pMVar1);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
      Kumu::Result_t::~Result_t((Result_t *)&local_80);
      if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
        if (*(char *)&TLVSet[2].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right
            == '\x01') {
          pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                                    MDD_Preface_ObjectModelVersion);
          TLVWriter::WriteUi32(&local_80,in_RDX,(ui32_t *)pMVar1);
          Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
          Kumu::Result_t::~Result_t((Result_t *)&local_80);
          if (*(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket < 0) {
            return this;
          }
        }
        pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                                  MDD_Preface_PrimaryPackage);
        TLVWriter::WriteObject(&local_80,in_RDX,(IArchive *)pMVar1);
        Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
        Kumu::Result_t::~Result_t((Result_t *)&local_80);
        if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
          pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                                    MDD_Preface_Identifications);
          TLVWriter::WriteObject(&local_80,in_RDX,(IArchive *)pMVar1);
          Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
          Kumu::Result_t::~Result_t((Result_t *)&local_80);
          if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
            pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                                      MDD_Preface_ContentStorage);
            TLVWriter::WriteObject(&local_80,in_RDX,(IArchive *)pMVar1);
            Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
            Kumu::Result_t::~Result_t((Result_t *)&local_80);
            if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
              pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                                        MDD_Core_OperationalPattern);
              TLVWriter::WriteObject(&local_80,in_RDX,(IArchive *)pMVar1);
              Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
              Kumu::Result_t::~Result_t((Result_t *)&local_80);
              if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
                pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                                          MDD_Core_EssenceContainers);
                TLVWriter::WriteObject(&local_80,in_RDX,(IArchive *)pMVar1);
                Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
                Kumu::Result_t::~Result_t((Result_t *)&local_80);
                if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
                  pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                                            MDD_Preface_DMSchemes);
                  TLVWriter::WriteObject(&local_80,in_RDX,(IArchive *)pMVar1);
                  Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
                  Kumu::Result_t::~Result_t((Result_t *)&local_80);
                  if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket)
                  {
                    if ((char)TLVSet[7].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header.
                              _M_color == _S_black) {
                      pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                                                MDD_Preface_ApplicationSchemes);
                      TLVWriter::WriteObject(&local_80,in_RDX,(IArchive *)pMVar1);
                      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
                      Kumu::Result_t::~Result_t((Result_t *)&local_80);
                      if (*(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket <
                          0) {
                        return this;
                      }
                    }
                    if ((char)TLVSet[8].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header.
                              _M_color == _S_black) {
                      pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                                                MDD_Preface_ConformsToSpecifications);
                      TLVWriter::WriteObject(&local_80,in_RDX,(IArchive *)pMVar1);
                      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
                      Kumu::Result_t::~Result_t((Result_t *)&local_80);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::Preface::WriteToTLVSet(TLVWriter& TLVSet)
{
  Result_t result = InterchangeObject::WriteToTLVSet(TLVSet);
  if ( ASDCP_SUCCESS(result) )  result = TLVSet.WriteObject(OBJ_WRITE_ARGS(Preface, LastModifiedDate));
  if ( ASDCP_SUCCESS(result) )  result = TLVSet.WriteUi16(OBJ_WRITE_ARGS(Preface, Version));
  if ( ASDCP_SUCCESS(result) && ! ObjectModelVersion.empty() )  result = TLVSet.WriteUi32(OBJ_WRITE_ARGS_OPT(Preface, ObjectModelVersion));
  if ( ASDCP_SUCCESS(result) )  result = TLVSet.WriteObject(OBJ_WRITE_ARGS_OPT(Preface, PrimaryPackage));
  if ( ASDCP_SUCCESS(result) )  result = TLVSet.WriteObject(OBJ_WRITE_ARGS(Preface, Identifications));
  if ( ASDCP_SUCCESS(result) )  result = TLVSet.WriteObject(OBJ_WRITE_ARGS(Preface, ContentStorage));
  if ( ASDCP_SUCCESS(result) )  result = TLVSet.WriteObject(OBJ_WRITE_ARGS(Preface, OperationalPattern));
  if ( ASDCP_SUCCESS(result) )  result = TLVSet.WriteObject(OBJ_WRITE_ARGS(Preface, EssenceContainers));
  if ( ASDCP_SUCCESS(result) )  result = TLVSet.WriteObject(OBJ_WRITE_ARGS(Preface, DMSchemes));
  if ( ASDCP_SUCCESS(result) && !ApplicationSchemes.empty() )
    {
      result = TLVSet.WriteObject(OBJ_WRITE_ARGS_OPT(Preface, ApplicationSchemes));
    }
  if ( ASDCP_SUCCESS(result) && !ConformsToSpecifications.empty())
    {
      result = TLVSet.WriteObject(OBJ_WRITE_ARGS_OPT(Preface, ConformsToSpecifications));
    }
  return result;
}